

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

t_object * __thiscall
xemmai::t_engine::f_new_type_on_boot<xemmai::t_native>
          (t_engine *this,size_t a_fields,t_type *a_super,t_object *a_module)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar2;
  long in_FS_OFFSET;
  int local_8c;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  local_88;
  t_object *a_module_local;
  t_type *a_super_local;
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  local_58;
  
  a_module_local = a_module;
  a_super_local = a_super;
  ptVar2 = f_allocate_for_type<xemmai::t_type_of<xemmai::t_native>>(this,a_fields);
  local_8c = 0;
  local_88.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  t_finalizes<xemmai::t_bears<xemmai::t_native,xemmai::t_type_of<xemmai::t_object>>>::
  t_finalizes<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*&,xemmai::t_object*&,unsigned_long_const&,int,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>>
            ((t_finalizes<xemmai::t_bears<xemmai::t_native,xemmai::t_type_of<xemmai::t_object>>> *)
             ptVar2->v_data,&t_bears<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,
             &a_super_local,&a_module_local,
             &t_derives<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>::c_NATIVE,&local_8c,
             &local_88,
             (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              *)&local_58);
  std::__uninitialized_default_novalue_n_1<false>::
  __uninit_default_novalue_n<std::pair<xemmai::t_slot,xemmai::t_value<xemmai::t_slot>>*,unsigned_long>
            ((pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *)&ptVar2[3].v_type,a_fields);
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_58);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_88);
  ptVar1 = this->v_type_type;
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar2->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar2;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  return ptVar2;
}

Assistant:

t_object* f_new_type_on_boot(size_t a_fields, t_type* a_super, t_object* a_module)
	{
		auto p = f_allocate_for_type<t_type_of<T>>(a_fields);
		std::uninitialized_default_construct_n((new(p->f_data()) t_type_of<T>(t_type_of<T>::c_IDS, a_super, a_module, t_type_of<T>::c_NATIVE, 0, std::vector<std::pair<t_root, t_rvalue>>{}, std::map<t_object*, size_t>{}))->f_fields(), a_fields);
		p->f_be(v_type_type);
		return p;
	}